

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_checkupvalcolor(global_State *g,UpVal *uv)

{
  byte bVar1;
  GCObject *o_00;
  GCObject *o;
  
  bVar1 = uv->marked;
  if ((bVar1 & 7) == 0) {
    if ((g->gckind != '\x02') && (1 < g->gcstate)) {
      uv->marked = g->currentwhite & 3 | bVar1 & 0xb8;
      return;
    }
    uv->marked = bVar1 & 0xb8 | 4;
    if (((uv->v->tt_ & 0x40) != 0) && (o_00 = (uv->v->value_).gc, ((o_00->gch).marked & 3) != 0)) {
      reallymarkobject(g,o_00);
      return;
    }
  }
  return;
}

Assistant:

void luaC_checkupvalcolor (global_State *g, UpVal *uv) {
  GCObject *o = obj2gco(uv);
  lua_assert(!isblack(o));  /* open upvalues are never black */
  if (isgray(o)) {
    if (keepinvariant(g)) {
      resetoldbit(o);  /* see MOVE OLD rule */
      gray2black(o);  /* it is being visited now */
      markvalue(g, uv->v);
    }
    else {
      lua_assert(issweepphase(g));
      makewhite(g, o);
    }
  }
}